

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_int8.h
# Opt level: O0

void ncnn::transpose_pack_B_tile_int8(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int kk_3;
  char *p0_3;
  int kk_2;
  char *p0_2;
  __m128i _si;
  __m128i _pp_2;
  __m128i _v127_1;
  int kk_1;
  __m128i _vindex;
  char *p0_1;
  __m128i _p;
  __m128i _pp_1;
  __m128i _p1_1;
  __m128i _p0_1;
  __m256i _pp;
  __m128i _p3;
  __m128i _p2;
  __m128i _p1;
  __m128i _p0;
  __m256i _v127;
  int kk;
  char *p0;
  int jj;
  char *pp;
  int B_hstep;
  __m128i _tmp1;
  __m128i _tmp0;
  int in_stack_fffffffffffff960;
  int in_stack_fffffffffffff964;
  int in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  Mat *in_stack_fffffffffffff970;
  undefined7 in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff97f;
  int local_67c;
  char *local_678;
  int local_66c;
  char *local_668;
  ulong local_650;
  ulong uStack_648;
  int local_624;
  undefined1 *local_608;
  ulong local_5f0;
  ulong uStack_5e8;
  ulong local_5c0;
  ulong uStack_5b8;
  ulong uStack_5b0;
  ulong uStack_5a8;
  undefined1 local_570 [16];
  undefined8 uStack_550;
  undefined8 uStack_548;
  int local_534;
  ulong *local_530;
  int local_524;
  ulong *local_520;
  
  iVar8 = cpu_support_x86_avx_vnni_int8();
  if (iVar8 == 0) {
    uVar1 = *(uint *)((long)in_RDI + 0x2c);
    local_520 = (ulong *)*in_RSI;
    for (local_524 = 0; local_524 + 7 < in_ECX; local_524 = local_524 + 8) {
      local_530 = (ulong *)(*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)in_R8D * in_RDI[2]
                           + (long)(in_EDX + local_524));
      local_534 = 0;
      auVar2 = vpinsrb_avx(ZEXT116(0x7f),0x7f,1);
      auVar2 = vpinsrb_avx(auVar2,0x7f,2);
      auVar2 = vpinsrb_avx(auVar2,0x7f,3);
      auVar2 = vpinsrb_avx(auVar2,0x7f,4);
      auVar2 = vpinsrb_avx(auVar2,0x7f,5);
      auVar2 = vpinsrb_avx(auVar2,0x7f,6);
      auVar2 = vpinsrb_avx(auVar2,0x7f,7);
      auVar2 = vpinsrb_avx(auVar2,0x7f,8);
      auVar2 = vpinsrb_avx(auVar2,0x7f,9);
      auVar2 = vpinsrb_avx(auVar2,0x7f,10);
      auVar2 = vpinsrb_avx(auVar2,0x7f,0xb);
      auVar2 = vpinsrb_avx(auVar2,0x7f,0xc);
      auVar2 = vpinsrb_avx(auVar2,0x7f,0xd);
      auVar2 = vpinsrb_avx(auVar2,0x7f,0xe);
      auVar2 = vpinsrb_avx(auVar2,0x7f,0xf);
      auVar3 = vpinsrb_avx(ZEXT116(0x7f),0x7f,1);
      auVar3 = vpinsrb_avx(auVar3,0x7f,2);
      auVar3 = vpinsrb_avx(auVar3,0x7f,3);
      auVar3 = vpinsrb_avx(auVar3,0x7f,4);
      auVar3 = vpinsrb_avx(auVar3,0x7f,5);
      auVar3 = vpinsrb_avx(auVar3,0x7f,6);
      auVar3 = vpinsrb_avx(auVar3,0x7f,7);
      auVar3 = vpinsrb_avx(auVar3,0x7f,8);
      auVar3 = vpinsrb_avx(auVar3,0x7f,9);
      auVar3 = vpinsrb_avx(auVar3,0x7f,10);
      auVar3 = vpinsrb_avx(auVar3,0x7f,0xb);
      auVar3 = vpinsrb_avx(auVar3,0x7f,0xc);
      auVar3 = vpinsrb_avx(auVar3,0x7f,0xd);
      auVar3 = vpinsrb_avx(auVar3,0x7f,0xe);
      auVar3 = vpinsrb_avx(auVar3,0x7f,0xf);
      auVar9 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
      for (; local_534 + 3 < in_R9D; local_534 = local_534 + 4) {
        local_570._8_8_ = 0;
        local_570._0_8_ = *local_530;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)((long)local_530 + (long)(int)uVar1);
        auVar4 = vpunpcklbw_avx(local_570,auVar4);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(ulong *)((long)local_530 + (long)(int)(uVar1 * 2));
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *(ulong *)((long)local_530 + (long)(int)(uVar1 * 3));
        auVar10 = vpunpcklbw_avx(auVar5,auVar10);
        auVar5 = vpunpcklwd_avx(auVar4,auVar10);
        auVar4 = vpunpckhwd_avx(auVar4,auVar10);
        uStack_548 = auVar9._8_8_;
        uStack_550 = auVar9._0_8_;
        auVar10 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
        uStack_5b0 = auVar10._0_8_;
        uStack_5a8 = auVar10._8_8_;
        auVar7._16_8_ = uStack_5b0;
        auVar7._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
        auVar7._24_8_ = uStack_5a8;
        auVar6._16_8_ = uStack_550;
        auVar6._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
        auVar6._24_8_ = uStack_548;
        auVar6 = vpaddb_avx2(auVar7,auVar6);
        local_5c0 = auVar6._0_8_;
        uStack_5b8 = auVar6._8_8_;
        uStack_5b0 = auVar6._16_8_;
        uStack_5a8 = auVar6._24_8_;
        *local_520 = local_5c0;
        local_520[1] = uStack_5b8;
        local_520[2] = uStack_5b0;
        local_520[3] = uStack_5a8;
        local_520 = local_520 + 4;
        local_530 = (ulong *)((long)local_530 + (long)(int)(uVar1 << 2));
      }
      for (; local_534 + 1 < in_R9D; local_534 = local_534 + 2) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *local_530;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)((long)local_530 + (long)(int)uVar1);
        auVar2 = vpunpcklbw_avx(auVar3,auVar2);
        local_5f0 = auVar2._0_8_;
        uStack_5e8 = auVar2._8_8_;
        *local_520 = local_5f0;
        local_520[1] = uStack_5e8;
        local_520 = local_520 + 2;
        local_530 = (ulong *)((long)local_530 + (long)(int)(uVar1 << 1));
      }
      for (; local_534 < in_R9D; local_534 = local_534 + 1) {
        *local_520 = *local_530;
        local_520 = local_520 + 1;
        local_530 = (ulong *)((long)local_530 + (long)(int)uVar1);
      }
    }
    for (; local_524 + 3 < in_ECX; local_524 = local_524 + 4) {
      local_608 = (undefined1 *)
                  (*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)in_R8D * in_RDI[2] +
                  (long)(in_EDX + local_524));
      auVar2 = vpinsrd_avx(ZEXT416(0),1,1);
      auVar2 = vpinsrd_avx(auVar2,2,2);
      auVar2 = vpinsrd_avx(auVar2,3,3);
      auVar3 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
      auVar3 = vpinsrd_avx(auVar3,uVar1,2);
      auVar3 = vpinsrd_avx(auVar3,uVar1,3);
      vpmulld_avx(auVar2,auVar3);
      local_624 = 0;
      auVar2 = vpinsrb_avx(ZEXT116(0x7f),0x7f,1);
      auVar2 = vpinsrb_avx(auVar2,0x7f,2);
      auVar2 = vpinsrb_avx(auVar2,0x7f,3);
      auVar2 = vpinsrb_avx(auVar2,0x7f,4);
      auVar2 = vpinsrb_avx(auVar2,0x7f,5);
      auVar2 = vpinsrb_avx(auVar2,0x7f,6);
      auVar2 = vpinsrb_avx(auVar2,0x7f,7);
      auVar2 = vpinsrb_avx(auVar2,0x7f,8);
      auVar2 = vpinsrb_avx(auVar2,0x7f,9);
      auVar2 = vpinsrb_avx(auVar2,0x7f,10);
      auVar2 = vpinsrb_avx(auVar2,0x7f,0xb);
      auVar2 = vpinsrb_avx(auVar2,0x7f,0xc);
      auVar2 = vpinsrb_avx(auVar2,0x7f,0xd);
      auVar2 = vpinsrb_avx(auVar2,0x7f,0xe);
      auVar2 = vpinsrb_avx(auVar2,0x7f,0xf);
      for (; local_624 + 3 < in_R9D; local_624 = local_624 + 4) {
        auVar3 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
        auVar3 = vpinsrd_avx(auVar3,0xffffffff,2);
        auVar3 = vpinsrd_avx(auVar3,0xffffffff,3);
        auVar9 = vpgatherdd(ZEXT816(0) << 0x40,auVar3);
        auVar3 = vpinsrb_avx(ZEXT116(0),4,1);
        auVar3 = vpinsrb_avx(auVar3,8,2);
        auVar3 = vpinsrb_avx(auVar3,0xc,3);
        auVar3 = vpinsrb_avx(auVar3,1,4);
        auVar3 = vpinsrb_avx(auVar3,5,5);
        auVar3 = vpinsrb_avx(auVar3,9,6);
        auVar3 = vpinsrb_avx(auVar3,0xd,7);
        auVar3 = vpinsrb_avx(auVar3,2,8);
        auVar3 = vpinsrb_avx(auVar3,6,9);
        auVar3 = vpinsrb_avx(auVar3,10,10);
        auVar3 = vpinsrb_avx(auVar3,0xe,0xb);
        auVar3 = vpinsrb_avx(auVar3,3,0xc);
        auVar3 = vpinsrb_avx(auVar3,7,0xd);
        auVar3 = vpinsrb_avx(auVar3,0xb,0xe);
        auVar3 = vpinsrb_avx(auVar3,0xf,0xf);
        auVar3 = vpshufb_avx(auVar9,auVar3);
        auVar3 = vpaddb_avx(auVar3,auVar2);
        local_650 = auVar3._0_8_;
        uStack_648 = auVar3._8_8_;
        *local_520 = local_650;
        local_520[1] = uStack_648;
        local_520 = local_520 + 2;
        local_608 = local_608 + (int)(uVar1 << 2);
      }
      for (; local_624 + 1 < in_R9D; local_624 = local_624 + 2) {
        *(undefined1 *)local_520 = *local_608;
        *(undefined1 *)((long)local_520 + 1) = local_608[(int)uVar1];
        *(undefined1 *)((long)local_520 + 2) = local_608[1];
        *(undefined1 *)((long)local_520 + 3) = local_608[(int)(uVar1 + 1)];
        *(undefined1 *)((long)local_520 + 4) = local_608[2];
        *(undefined1 *)((long)local_520 + 5) = local_608[(int)(uVar1 + 2)];
        *(undefined1 *)((long)local_520 + 6) = local_608[3];
        *(undefined1 *)((long)local_520 + 7) = local_608[(int)(uVar1 + 3)];
        local_520 = local_520 + 1;
        local_608 = local_608 + (int)(uVar1 << 1);
      }
      for (; local_624 < in_R9D; local_624 = local_624 + 1) {
        *(undefined1 *)local_520 = *local_608;
        *(undefined1 *)((long)local_520 + 1) = local_608[1];
        *(undefined1 *)((long)local_520 + 2) = local_608[2];
        *(undefined1 *)((long)local_520 + 3) = local_608[3];
        local_520 = (ulong *)((long)local_520 + 4);
        local_608 = local_608 + (int)uVar1;
      }
    }
    for (; local_524 + 1 < in_ECX; local_524 = local_524 + 2) {
      local_668 = (char *)(*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)in_R8D * in_RDI[2]
                          + (long)(in_EDX + local_524));
      for (local_66c = 0; local_66c + 3 < in_R9D; local_66c = local_66c + 4) {
        *(char *)local_520 = *local_668 + '\x7f';
        *(char *)((long)local_520 + 1) = local_668[(int)uVar1] + '\x7f';
        *(char *)((long)local_520 + 2) = local_668[(int)(uVar1 << 1)] + '\x7f';
        *(char *)((long)local_520 + 3) = local_668[(int)(uVar1 * 3)] + '\x7f';
        *(char *)((long)local_520 + 4) = local_668[1] + '\x7f';
        *(char *)((long)local_520 + 5) = local_668[(int)(uVar1 + 1)] + '\x7f';
        *(char *)((long)local_520 + 6) = local_668[(int)(uVar1 * 2 + 1)] + '\x7f';
        *(char *)((long)local_520 + 7) = local_668[(int)(uVar1 * 3 + 1)] + '\x7f';
        local_520 = local_520 + 1;
        local_668 = local_668 + (int)(uVar1 << 2);
      }
      for (; local_66c + 1 < in_R9D; local_66c = local_66c + 2) {
        *(char *)local_520 = *local_668;
        *(char *)((long)local_520 + 1) = local_668[(int)uVar1];
        *(char *)((long)local_520 + 2) = local_668[1];
        *(char *)((long)local_520 + 3) = local_668[(int)(uVar1 + 1)];
        local_520 = (ulong *)((long)local_520 + 4);
        local_668 = local_668 + (int)(uVar1 << 1);
      }
      for (; local_66c < in_R9D; local_66c = local_66c + 1) {
        *(char *)local_520 = *local_668;
        *(char *)((long)local_520 + 1) = local_668[1];
        local_520 = (ulong *)((long)local_520 + 2);
        local_668 = local_668 + (int)uVar1;
      }
    }
    for (; local_524 < in_ECX; local_524 = local_524 + 1) {
      local_678 = (char *)(*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)in_R8D * in_RDI[2]
                          + (long)(in_EDX + local_524));
      for (local_67c = 0; local_67c + 3 < in_R9D; local_67c = local_67c + 4) {
        *(char *)local_520 = *local_678 + '\x7f';
        *(char *)((long)local_520 + 1) = local_678[(int)uVar1] + '\x7f';
        *(char *)((long)local_520 + 2) = local_678[(int)(uVar1 << 1)] + '\x7f';
        *(char *)((long)local_520 + 3) = local_678[(int)(uVar1 * 3)] + '\x7f';
        local_520 = (ulong *)((long)local_520 + 4);
        local_678 = local_678 + (int)(uVar1 << 2);
      }
      for (; local_67c < in_R9D; local_67c = local_67c + 1) {
        *(char *)local_520 = *local_678;
        local_520 = (ulong *)((long)local_520 + 1);
        local_678 = local_678 + (int)uVar1;
      }
    }
  }
  else {
    transpose_pack_B_tile_int8_avxvnniint8
              ((Mat *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff968,
               in_stack_fffffffffffff964,in_stack_fffffffffffff960);
  }
  return;
}

Assistant:

static void transpose_pack_B_tile_int8(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        transpose_pack_B_tile_int8_avx512vnni(B, BT, j, max_jj, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNIINT8 && __AVX__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni_int8())
    {
        transpose_pack_B_tile_int8_avxvnniint8(B, BT, j, max_jj, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        transpose_pack_B_tile_int8_avxvnni(B, BT, j, max_jj, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx2())
    {
        transpose_pack_B_tile_int8_avx2(B, BT, j, max_jj, k, max_kk);
        return;
    }
#endif

    // NCNN_LOGE("transpose_pack_B_tile_int8");
    // assert B.elempack == 1
    // assert B.dims == 2

    const int B_hstep = B.w;

    signed char* pp = BT;

    int jj = 0;
#if __SSE2__
#if defined(__x86_64__) || defined(_M_X64)
#if __AVX512F__
    for (; jj + 15 < max_jj; jj += 16)
    {
        const signed char* p0 = B.row<const signed char>(k) + (j + jj);

        int kk = 0;
#if __AVX512VNNI__
        __m512i _v127 = _mm512_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p0 = _mm_loadu_si128((const __m128i*)p0);
            __m128i _p1 = _mm_loadu_si128((const __m128i*)(p0 + B_hstep));
            __m128i _p2 = _mm_loadu_si128((const __m128i*)(p0 + B_hstep * 2));
            __m128i _p3 = _mm_loadu_si128((const __m128i*)(p0 + B_hstep * 3));
            transpose16x4_epi8(_p0, _p1, _p2, _p3);
            __m512i _pp = combine4x4_epi32(_p0, _p1, _p2, _p3);
            _pp = _mm512_add_epi8(_pp, _v127);
            _mm512_storeu_si512((__m512i*)pp, _pp);
            pp += 64;
            p0 += B_hstep * 4;
        }
#endif // __AVX512VNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            __m128i _p0 = _mm_loadu_si128((const __m128i*)p0);
            __m128i _p1 = _mm_loadu_si128((const __m128i*)(p0 + B_hstep));
            __m128i _t0 = _mm_unpacklo_epi8(_p0, _p1);
            __m128i _t1 = _mm_unpackhi_epi8(_p0, _p1);
            _mm_store_si128((__m128i*)pp, _t0);
            _mm_store_si128((__m128i*)(pp + 16), _t1);
            pp += 32;
            p0 += B_hstep * 2;
        }
        for (; kk < max_kk; kk++)
        {
            __m128i _p = _mm_loadu_si128((const __m128i*)p0);
            _mm_store_si128((__m128i*)pp, _p);
            pp += 16;
            p0 += B_hstep;
        }
    }
#endif // __AVX512F__
    for (; jj + 7 < max_jj; jj += 8)
    {
        const signed char* p0 = B.row<const signed char>(k) + (j + jj);

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p0 = _mm_loadl_epi64((const __m128i*)p0);
            __m128i _p1 = _mm_loadl_epi64((const __m128i*)(p0 + B_hstep));
            __m128i _p2 = _mm_loadl_epi64((const __m128i*)(p0 + B_hstep * 2));
            __m128i _p3 = _mm_loadl_epi64((const __m128i*)(p0 + B_hstep * 3));
            transpose8x4_epi8(_p0, _p1, _p2, _p3);
            __m256i _pp = combine4x2_epi32(_p0, _p1);
            _mm256_storeu_si256((__m256i*)pp, _pp);
            pp += 32;
            p0 += B_hstep * 4;
        }
#else  // __AVXVNNIINT8__
        __m256i _v127 = _mm256_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p0 = _mm_loadl_epi64((const __m128i*)p0);
            __m128i _p1 = _mm_loadl_epi64((const __m128i*)(p0 + B_hstep));
            __m128i _p2 = _mm_loadl_epi64((const __m128i*)(p0 + B_hstep * 2));
            __m128i _p3 = _mm_loadl_epi64((const __m128i*)(p0 + B_hstep * 3));
            transpose8x4_epi8(_p0, _p1, _p2, _p3);
            __m256i _pp = combine4x2_epi32(_p0, _p1);
            _pp = _mm256_add_epi8(_pp, _v127);
            _mm256_storeu_si256((__m256i*)pp, _pp);
            pp += 32;
            p0 += B_hstep * 4;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            __m128i _p0 = _mm_loadl_epi64((const __m128i*)p0);
            __m128i _p1 = _mm_loadl_epi64((const __m128i*)(p0 + B_hstep));
            __m128i _pp = _mm_unpacklo_epi8(_p0, _p1);
#if __AVX512F__
            _mm_store_si128((__m128i*)pp, _pp);
#else
            _mm_storeu_si128((__m128i*)pp, _pp);
#endif
            pp += 16;
            p0 += B_hstep * 2;
        }
        for (; kk < max_kk; kk++)
        {
            __m128i _p = _mm_loadl_epi64((const __m128i*)p0);
            _mm_storel_epi64((__m128i*)pp, _p);
            pp += 8;
            p0 += B_hstep;
        }
    }
#endif // defined(__x86_64__) || defined(_M_X64)
    for (; jj + 3 < max_jj; jj += 4)
    {
        const signed char* p0 = B.row<const signed char>(k) + (j + jj);

#if __AVX512VNNI__ || __AVXVNNI__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(B_hstep));
#endif // __AVX512VNNI__ || __AVXVNNI__

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _pp = _mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            __m128i _si = _mm_setr_epi8(0, 4, 8, 12, 1, 5, 9, 13, 2, 6, 10, 14, 3, 7, 11, 15);
            _pp = _mm_shuffle_epi8(_pp, _si);
            _mm_storeu_si128((__m128i*)pp, _pp);
            pp += 16;
            p0 += B_hstep * 4;
        }
#else  // __AVXVNNIINT8__
        __m128i _v127 = _mm_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _pp = _mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            __m128i _si = _mm_setr_epi8(0, 4, 8, 12, 1, 5, 9, 13, 2, 6, 10, 14, 3, 7, 11, 15);
            _pp = _mm_shuffle_epi8(_pp, _si);
            _pp = _mm_add_epi8(_pp, _v127);
            _mm_storeu_si128((__m128i*)pp, _pp);
            pp += 16;
            p0 += B_hstep * 4;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            pp[0] = p0[0];
            pp[1] = p0[B_hstep];
            pp[2] = p0[1];
            pp[3] = p0[B_hstep + 1];
            pp[4] = p0[2];
            pp[5] = p0[B_hstep + 2];
            pp[6] = p0[3];
            pp[7] = p0[B_hstep + 3];
            pp += 8;
            p0 += B_hstep * 2;
        }
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            pp += 4;
            p0 += B_hstep;
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
        const signed char* p0 = B.row<const signed char>(k) + (j + jj);

        int kk = 0;
#if __SSE2__
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[B_hstep];
            pp[2] = p0[B_hstep * 2];
            pp[3] = p0[B_hstep * 3];
            pp[4] = p0[1];
            pp[5] = p0[B_hstep + 1];
            pp[6] = p0[B_hstep * 2 + 1];
            pp[7] = p0[B_hstep * 3 + 1];
            pp += 8;
            p0 += B_hstep * 4;
        }
#else  // __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0] + 127;
            pp[1] = p0[B_hstep] + 127;
            pp[2] = p0[B_hstep * 2] + 127;
            pp[3] = p0[B_hstep * 3] + 127;
            pp[4] = p0[1] + 127;
            pp[5] = p0[B_hstep + 1] + 127;
            pp[6] = p0[B_hstep * 2 + 1] + 127;
            pp[7] = p0[B_hstep * 3 + 1] + 127;
            pp += 8;
            p0 += B_hstep * 4;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            pp[0] = p0[0];
            pp[1] = p0[B_hstep];
            pp[2] = p0[1];
            pp[3] = p0[B_hstep + 1];
            pp += 4;
            p0 += B_hstep * 2;
        }
#endif // __SSE2__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp += 2;
            p0 += B_hstep;
        }
    }
    for (; jj < max_jj; jj += 1)
    {
        const signed char* p0 = B.row<const signed char>(k) + (j + jj);

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[B_hstep];
            pp[2] = p0[B_hstep * 2];
            pp[3] = p0[B_hstep * 3];
            pp += 4;
            p0 += B_hstep * 4;
        }
#else  // __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0] + 127;
            pp[1] = p0[B_hstep] + 127;
            pp[2] = p0[B_hstep * 2] + 127;
            pp[3] = p0[B_hstep * 3] + 127;
            pp += 4;
            p0 += B_hstep * 4;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp += 1;
            p0 += B_hstep;
        }
    }
}